

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariablesBodySharedMass.cpp
# Opt level: O2

void __thiscall
chrono::ChVariablesBodySharedMass::Compute_inc_invMb_v
          (ChVariablesBodySharedMass *this,ChVectorRef *result,ChVectorConstRef vect)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  long lVar12;
  uint __line;
  int iVar13;
  Scalar *pSVar14;
  char *__assertion;
  CoeffReturnType CVar15;
  CoeffReturnType CVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  lVar12 = (vect->
           super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
           ).
           super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
           .m_rows.m_value;
  iVar13 = (*(this->super_ChVariablesBody).super_ChVariables._vptr_ChVariables[2])();
  if (lVar12 == iVar13) {
    lVar12 = *(long *)&(result->
                       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                       ).field_0x8;
    iVar13 = (*(this->super_ChVariablesBody).super_ChVariables._vptr_ChVariables[2])(this);
    if (lVar12 == iVar13) {
      dVar1 = this->sharedmass->inv_mass;
      CVar15 = Eigen::
               DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
               ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                             *)vect,0);
      pSVar14 = Eigen::
                DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                              *)result,0);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = dVar1;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = CVar15;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = *pSVar14;
      auVar3 = vfmadd213sd_fma(auVar26,auVar17,auVar3);
      *pSVar14 = auVar3._0_8_;
      dVar1 = this->sharedmass->inv_mass;
      CVar15 = Eigen::
               DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
               ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                             *)vect,1);
      pSVar14 = Eigen::
                DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                              *)result,1);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = dVar1;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = CVar15;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = *pSVar14;
      auVar3 = vfmadd213sd_fma(auVar27,auVar18,auVar4);
      *pSVar14 = auVar3._0_8_;
      dVar1 = this->sharedmass->inv_mass;
      CVar15 = Eigen::
               DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
               ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                             *)vect,2);
      pSVar14 = Eigen::
                DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                              *)result,2);
      auVar19._8_8_ = 0;
      auVar19._0_8_ = dVar1;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = CVar15;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = *pSVar14;
      auVar3 = vfmadd213sd_fma(auVar28,auVar19,auVar5);
      *pSVar14 = auVar3._0_8_;
      dVar1 = (this->sharedmass->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
      ;
      CVar15 = Eigen::
               DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
               ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                             *)vect,3);
      dVar2 = (this->sharedmass->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1]
      ;
      CVar16 = Eigen::
               DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
               ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                             *)vect,4);
      auVar29._8_8_ = 0;
      auVar29._0_8_ = CVar15;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = dVar1;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = CVar16 * dVar2;
      auVar3 = vfmadd231sd_fma(auVar20,auVar29,auVar6);
      dVar1 = (this->sharedmass->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2]
      ;
      auVar23._0_8_ =
           Eigen::
           DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
           ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                         *)vect,5);
      auVar23._8_56_ = extraout_var;
      auVar34._8_8_ = 0;
      auVar34._0_8_ = dVar1;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = auVar3._0_8_;
      auVar3 = vfmadd213sd_fma(auVar23._0_16_,auVar34,auVar7);
      pSVar14 = Eigen::
                DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                              *)result,3);
      *pSVar14 = auVar3._0_8_ + *pSVar14;
      dVar1 = (this->sharedmass->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3]
      ;
      CVar15 = Eigen::
               DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
               ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                             *)vect,3);
      dVar2 = (this->sharedmass->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4]
      ;
      CVar16 = Eigen::
               DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
               ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                             *)vect,4);
      auVar30._8_8_ = 0;
      auVar30._0_8_ = CVar15;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = dVar1;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = CVar16 * dVar2;
      auVar3 = vfmadd231sd_fma(auVar21,auVar30,auVar8);
      dVar1 = (this->sharedmass->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5]
      ;
      auVar24._0_8_ =
           Eigen::
           DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
           ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                         *)vect,5);
      auVar24._8_56_ = extraout_var_00;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = dVar1;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = auVar3._0_8_;
      auVar3 = vfmadd213sd_fma(auVar24._0_16_,auVar31,auVar9);
      pSVar14 = Eigen::
                DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                              *)result,4);
      *pSVar14 = auVar3._0_8_ + *pSVar14;
      dVar1 = (this->sharedmass->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6]
      ;
      CVar15 = Eigen::
               DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
               ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                             *)vect,3);
      dVar2 = (this->sharedmass->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7]
      ;
      CVar16 = Eigen::
               DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
               ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                             *)vect,4);
      auVar32._8_8_ = 0;
      auVar32._0_8_ = CVar15;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = dVar1;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = CVar16 * dVar2;
      auVar3 = vfmadd231sd_fma(auVar22,auVar32,auVar10);
      dVar1 = (this->sharedmass->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8]
      ;
      auVar25._0_8_ =
           Eigen::
           DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
           ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                         *)vect,5);
      auVar25._8_56_ = extraout_var_01;
      auVar33._8_8_ = 0;
      auVar33._0_8_ = dVar1;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = auVar3._0_8_;
      auVar3 = vfmadd213sd_fma(auVar25._0_16_,auVar33,auVar11);
      pSVar14 = Eigen::
                DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                              *)result,5);
      *pSVar14 = auVar3._0_8_ + *pSVar14;
      return;
    }
    __assertion = "result.size() == Get_ndof()";
    __line = 0x5d;
  }
  else {
    __assertion = "vect.size() == Get_ndof()";
    __line = 0x5c;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/solver/ChVariablesBodySharedMass.cpp"
                ,__line,
                "virtual void chrono::ChVariablesBodySharedMass::Compute_inc_invMb_v(ChVectorRef, ChVectorConstRef) const"
               );
}

Assistant:

void ChVariablesBodySharedMass::Compute_inc_invMb_v(ChVectorRef result, ChVectorConstRef vect) const {
    assert(vect.size() == Get_ndof());
    assert(result.size() == Get_ndof());

    // optimized unrolled operations
    result(0) += sharedmass->inv_mass * vect(0);
    result(1) += sharedmass->inv_mass * vect(1);
    result(2) += sharedmass->inv_mass * vect(2);
    result(3) += sharedmass->inv_inertia(0, 0) * vect(3) + sharedmass->inv_inertia(0, 1) * vect(4) +
                 sharedmass->inv_inertia(0, 2) * vect(5);
    result(4) += sharedmass->inv_inertia(1, 0) * vect(3) + sharedmass->inv_inertia(1, 1) * vect(4) +
                 sharedmass->inv_inertia(1, 2) * vect(5);
    result(5) += sharedmass->inv_inertia(2, 0) * vect(3) + sharedmass->inv_inertia(2, 1) * vect(4) +
                 sharedmass->inv_inertia(2, 2) * vect(5);
}